

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_dynamic_import_job(JSContext *ctx,int argc,JSValue *argv)

{
  JSValue val1;
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue v_02;
  JSValue this_obj;
  JSValue this_obj_00;
  JSValue JVar1;
  int iVar2;
  char *pcVar3;
  JSModuleDef *pJVar4;
  long in_RDX;
  JSContext *in_RDI;
  JSValue JVar5;
  JSValue ns;
  JSValue err;
  JSValue ret;
  char *filename;
  char *basename;
  JSModuleDef *m;
  JSValue specifier;
  JSValue basename_val;
  JSValue *resolving_funcs;
  JSValueUnion in_stack_fffffffffffffee8;
  JSContext *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffefc;
  JSContext *in_stack_ffffffffffffff00;
  JSContext *ctx_00;
  undefined1 in_stack_ffffffffffffff08 [16];
  undefined1 in_stack_ffffffffffffff18 [16];
  undefined1 auVar7 [12];
  undefined4 in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff2c;
  int64_t in_stack_ffffffffffffff30;
  JSValue in_stack_ffffffffffffff38;
  JSContext *in_stack_ffffffffffffff48;
  JSValue *local_a8;
  uint uStack_c;
  
  auVar7 = in_stack_ffffffffffffff18._4_12_;
  iVar2 = JS_IsString(*(JSValue *)(in_RDX + 0x20));
  if (iVar2 == 0) {
    JVar5 = JS_ThrowTypeError(in_RDI,"no function filename for import()");
    local_a8 = (JSValue *)JVar5.tag;
  }
  else {
    JVar5.tag = (int64_t)in_stack_fffffffffffffef0;
    JVar5.u.ptr = in_stack_fffffffffffffee8.ptr;
    pcVar3 = JS_ToCString((JSContext *)0x164bd6,JVar5);
    if ((pcVar3 != (char *)0x0) &&
       (val1.tag = (int64_t)in_stack_fffffffffffffef0, val1.u.ptr = in_stack_fffffffffffffee8.ptr,
       pcVar3 = JS_ToCString((JSContext *)0x164c0b,val1), pcVar3 != (char *)0x0)) {
      pJVar4 = JS_RunModule(in_stack_ffffffffffffff48,(char *)in_stack_ffffffffffffff38.tag,
                            (char *)in_stack_ffffffffffffff38.u.ptr);
      JS_FreeCString(in_stack_ffffffffffffff00,
                     (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      if (pJVar4 != (JSModuleDef *)0x0) {
        JVar5 = js_get_module_ns(in_stack_ffffffffffffff08._8_8_,in_stack_ffffffffffffff08._0_8_);
        iVar2 = JS_IsException(JVar5);
        if (iVar2 == 0) {
          this_obj.tag = 3;
          this_obj.u.ptr = (void *)((ulong)in_stack_ffffffffffffff2c << 0x20);
          JS_Call(auVar7._4_8_,in_stack_ffffffffffffff38,this_obj,auVar7._0_4_,local_a8);
          v.u._4_4_ = in_stack_fffffffffffffefc;
          v.u.int32 = in_stack_fffffffffffffef8;
          v.tag = (int64_t)in_stack_ffffffffffffff00;
          JS_FreeValue(in_stack_fffffffffffffef0,v);
          v_00.u._4_4_ = in_stack_fffffffffffffefc;
          v_00.u.int32 = in_stack_fffffffffffffef8;
          v_00.tag = (int64_t)in_stack_ffffffffffffff00;
          JS_FreeValue(in_stack_fffffffffffffef0,v_00);
          JS_FreeCString(in_stack_ffffffffffffff00,
                         (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
          goto LAB_00164ea2;
        }
      }
    }
  }
  JVar5 = JS_GetException(in_RDI);
  uVar6 = 0;
  ctx_00 = (JSContext *)0x3;
  this_obj_00.u._4_4_ = in_stack_ffffffffffffff2c;
  this_obj_00.u.int32 = in_stack_ffffffffffffff28;
  this_obj_00.tag = in_stack_ffffffffffffff30;
  JS_Call((JSContext *)JVar5.tag,in_stack_ffffffffffffff38,this_obj_00,JVar5.u._4_4_,local_a8);
  v_01.u._4_4_ = in_stack_fffffffffffffefc;
  v_01.u.int32 = uVar6;
  v_01.tag = (int64_t)ctx_00;
  JS_FreeValue(in_stack_fffffffffffffef0,v_01);
  v_02.u._4_4_ = in_stack_fffffffffffffefc;
  v_02.u.int32 = uVar6;
  v_02.tag = (int64_t)ctx_00;
  JS_FreeValue(in_stack_fffffffffffffef0,v_02);
  JS_FreeCString(ctx_00,(char *)CONCAT44(in_stack_fffffffffffffefc,uVar6));
LAB_00164ea2:
  JVar1.tag = 3;
  JVar1.u.ptr = (void *)((ulong)uStack_c << 0x20);
  return JVar1;
}

Assistant:

static JSValue js_dynamic_import_job(JSContext *ctx,
                                     int argc, JSValueConst *argv)
{
    JSValueConst *resolving_funcs = argv;
    JSValueConst basename_val = argv[2];
    JSValueConst specifier = argv[3];
    JSModuleDef *m;
    const char *basename = NULL, *filename;
    JSValue ret, err, ns;

    if (!JS_IsString(basename_val)) {
        JS_ThrowTypeError(ctx, "no function filename for import()");
        goto exception;
    }
    basename = JS_ToCString(ctx, basename_val);
    if (!basename)
        goto exception;

    filename = JS_ToCString(ctx, specifier);
    if (!filename)
        goto exception;
                     
    m = JS_RunModule(ctx, basename, filename);
    JS_FreeCString(ctx, filename);
    if (!m)
        goto exception;

    /* return the module namespace */
    ns = js_get_module_ns(ctx, m);
    if (JS_IsException(ns))
        goto exception;

    ret = JS_Call(ctx, resolving_funcs[0], JS_UNDEFINED,
                   1, (JSValueConst *)&ns);
    JS_FreeValue(ctx, ret); /* XXX: what to do if exception ? */
    JS_FreeValue(ctx, ns);
    JS_FreeCString(ctx, basename);
    return JS_UNDEFINED;
 exception:

    err = JS_GetException(ctx);
    ret = JS_Call(ctx, resolving_funcs[1], JS_UNDEFINED,
                   1, (JSValueConst *)&err);
    JS_FreeValue(ctx, ret); /* XXX: what to do if exception ? */
    JS_FreeValue(ctx, err);
    JS_FreeCString(ctx, basename);
    return JS_UNDEFINED;
}